

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

Result ParseWasmValue(string *argument,Value *val)

{
  char *pcVar1;
  int iVar2;
  Result rhs;
  ulong uVar3;
  undefined1 *puVar4;
  long lVar5;
  u64 local_70;
  uint64_t parsed_value_3;
  u32 local_60;
  Enum local_5c;
  uint32_t parsed_value_2;
  uint64_t parsed_value_1;
  char *pcStack_48;
  uint32_t parsed_value;
  char *pval_end;
  char *pval;
  char *ptype;
  size_t cindex;
  Value *pVStack_20;
  Result result;
  Value *val_local;
  string *argument_local;
  
  pVStack_20 = val;
  wabt::Result::Result((Result *)((long)&cindex + 4),Ok);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (ptype = (char *)std::__cxx11::string::find((char)argument,0x3a),
     ptype != (char *)0xffffffffffffffff)) {
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)argument);
    *puVar4 = 0;
    pval = (char *)std::__cxx11::string::c_str();
    lVar5 = std::__cxx11::string::c_str();
    pcVar1 = pval;
    pval_end = ptype + lVar5 + 1;
    lVar5 = std::__cxx11::string::length();
    pcStack_48 = pcVar1 + lVar5;
    iVar2 = strcmp(pval,"i32");
    if (iVar2 == 0) {
      parsed_value_1._0_4_ =
           wabt::ParseInt32(pval_end,pcStack_48,(uint32_t *)((long)&parsed_value_1 + 4),UnsignedOnly
                           );
      wabt::Result::operator|=((Result *)((long)&cindex + 4),parsed_value_1._0_4_);
      wabt::interp::Value::Set<unsigned_int>(pVStack_20,parsed_value_1._4_4_);
    }
    iVar2 = strcmp(pval,"i64");
    if (iVar2 == 0) {
      local_5c = (Enum)wabt::ParseInt64(pval_end,pcStack_48,(uint64_t *)&parsed_value_2,UnsignedOnly
                                       );
      wabt::Result::operator|=((Result *)((long)&cindex + 4),(Result)local_5c);
      wabt::interp::Value::Set<unsigned_long>(pVStack_20,_parsed_value_2);
    }
    iVar2 = strcmp(pval,"f32");
    if (iVar2 == 0) {
      parsed_value_3._4_4_ = wabt::ParseFloat(Float,pval_end,pcStack_48,&local_60);
      wabt::Result::operator|=((Result *)((long)&cindex + 4),parsed_value_3._4_4_);
      wabt::interp::Value::Set<unsigned_int>(pVStack_20,local_60);
    }
    iVar2 = strcmp(pval,"f64");
    if (iVar2 == 0) {
      rhs = wabt::ParseDouble(Float,pval_end,pcStack_48,&local_70);
      wabt::Result::operator|=((Result *)((long)&cindex + 4),rhs);
      wabt::interp::Value::Set<unsigned_long>(pVStack_20,local_70);
    }
    return (Result)cindex._4_4_;
  }
  wabt::Result::Result((Result *)((long)&argument_local + 4),Error);
  return (Result)argument_local._4_4_;
}

Assistant:

Result ParseWasmValue(std::string argument, Value& val) {
  Result result = Result::Ok;

  size_t cindex;
  if (argument.empty() || (cindex = argument.find(':')) == std::string::npos) {
    return wabt::Result::Error;
  }

  argument[cindex] = '\0';
  const char* ptype = argument.c_str();
  const char* pval = argument.c_str() + cindex + 1;
  const char* pval_end = ptype + argument.length();

  if (strcmp(ptype, "i32") == 0) {
    uint32_t parsed_value;
    result |=
        ParseInt32(pval, pval_end, &parsed_value, ParseIntType::UnsignedOnly);
    val.Set(parsed_value);
  }
  if (strcmp(ptype, "i64") == 0) {
    uint64_t parsed_value;
    result |=
        ParseInt64(pval, pval_end, &parsed_value, ParseIntType::UnsignedOnly);
    val.Set(parsed_value);
  }
  if (strcmp(ptype, "f32") == 0) {
    uint32_t parsed_value;
    result |= ParseFloat(LiteralType::Float, pval, pval_end, &parsed_value);
    val.Set(parsed_value);
  }
  if (strcmp(ptype, "f64") == 0) {
    uint64_t parsed_value;
    result |= ParseDouble(LiteralType::Float, pval, pval_end, &parsed_value);
    val.Set(parsed_value);
  }
  return result;
}